

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O3

void __thiscall
Style::Style::parseFields
          (Style *this,xml_node<char> *def,
          unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
          *fields)

{
  int iVar1;
  ostream *poVar2;
  logic_error *plVar3;
  xml_attribute<char> *pxVar4;
  char *pcVar5;
  xml_node<char> *pxVar6;
  Field field;
  string attrVal;
  u16string name;
  __hashtable *__h;
  string attrName;
  allocator<char> local_161;
  Field local_160;
  UtfHandler *local_100;
  long *local_f8;
  long local_f0;
  long local_e8 [2];
  u16string local_d8;
  _Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_b8;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
  local_b0;
  
  pxVar6 = def->m_first_node;
  if (pxVar6 != (xml_node<char> *)0x0) {
    local_100 = &this->utf;
    local_b8 = (_Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)fields;
    do {
      pcVar5 = (pxVar6->super_xml_base<char>).m_name;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      iVar1 = strcmp(pcVar5,"bcf:field");
      if (iVar1 != 0) {
        plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar3,"Unexpected node name");
        __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pcVar5 = (pxVar6->super_xml_base<char>).m_value;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,pcVar5,(allocator<char> *)&local_160);
      UtfHandler::utf8to16(&local_d8,local_100,(string *)&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
        operator_delete(local_b0.first._M_dataplus._M_p,
                        local_b0.first.field_2._M_allocated_capacity + 1);
      }
      local_160.name._M_dataplus._M_p = (pointer)&local_160.name.field_2;
      std::__cxx11::u16string::_M_construct<char16_t*>
                ((u16string *)&local_160,local_d8._M_dataplus._M_p,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      local_160.constraintType = None;
      local_160.rangeMax = 0;
      local_160.rangeMin = 0;
      local_160.dataType = Literal;
      local_160.nullok = false;
      local_160.skipout = false;
      local_160.label = false;
      local_160.type = Field;
      local_160.format = Unspecified;
      local_160.pattern._M_dataplus._M_p = (pointer)&local_160.pattern.field_2;
      local_160.pattern._M_string_length = 0;
      local_160.pattern.field_2._M_local_buf[0] = '\0';
      for (pxVar4 = pxVar6->m_first_attribute; pxVar4 != (xml_attribute<char> *)0x0;
          pxVar4 = pxVar4->m_next_attribute) {
        pcVar5 = (pxVar4->super_xml_base<char>).m_name;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b0,pcVar5,(allocator<char> *)&local_f8);
        pcVar5 = (pxVar4->super_xml_base<char>).m_value;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar5,&local_161);
        iVar1 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar1 == 0) {
          iVar1 = std::__cxx11::string::compare((char *)&local_f8);
          if (iVar1 == 0) {
            local_160.type = Field;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&local_f8);
            if (iVar1 != 0) {
              plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar3,"Unexpected result");
              __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            local_160.type = List;
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)&local_b0);
          if (iVar1 == 0) {
            iVar1 = std::__cxx11::string::compare((char *)&local_f8);
            if (iVar1 == 0) {
              local_160.dataType = Literal;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)&local_f8);
              if (iVar1 == 0) {
                local_160.dataType = Name;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                if (iVar1 == 0) {
                  local_160.dataType = Key;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                  if (iVar1 == 0) {
                    local_160.dataType = EntryKey;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                    if (iVar1 == 0) {
                      local_160.dataType = Date;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                      if (iVar1 == 0) {
                        local_160.dataType = Verbatim;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                        if (iVar1 == 0) {
                          local_160.dataType = Integer;
                        }
                        else {
                          iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                          if (iVar1 == 0) {
                            local_160.dataType = Range;
                          }
                          else {
                            iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                            if (iVar1 == 0) {
                              local_160.dataType = Code;
                            }
                            else {
                              iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                              if (iVar1 == 0) {
                                local_160.dataType = URI;
                              }
                              else {
                                iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                                if (iVar1 == 0) {
                                  local_160.dataType = Datepart;
                                }
                                else {
                                  iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                                  if (iVar1 == 0) {
                                    local_160.dataType = Keyword;
                                  }
                                  else {
                                    iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                                    if (iVar1 == 0) {
                                      local_160.dataType = Option;
                                    }
                                    else {
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                ((ostream *)&std::cerr,"Unhandled datatype ",0x13);
                                      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                                         ((ostream *)&std::cerr,(char *)local_f8,
                                                          local_f0);
                                      std::__ostream_insert<char,std::char_traits<char>>
                                                (poVar2,"\n",1);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)&local_b0);
            if (iVar1 == 0) {
              iVar1 = std::__cxx11::string::compare((char *)&local_f8);
              if (iVar1 == 0) {
                local_160.format = XSV;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unhandled format ",0x11);
                poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)&std::cerr,(char *)local_f8,local_f0);
                std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
                local_160.format = Other;
              }
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)&local_b0);
              if (iVar1 == 0) {
                iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                if (iVar1 == 0) {
                  local_160.nullok = true;
                }
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)&local_b0);
                if (iVar1 == 0) {
                  iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                  if (iVar1 == 0) {
                    local_160.skipout = true;
                  }
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)&local_b0);
                  if (iVar1 == 0) {
                    iVar1 = std::__cxx11::string::compare((char *)&local_f8);
                    if (iVar1 == 0) {
                      local_160.label = true;
                    }
                  }
                }
              }
            }
          }
        }
        if (local_f8 != local_e8) {
          operator_delete(local_f8,local_e8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
          operator_delete(local_b0.first._M_dataplus._M_p,
                          local_b0.first.field_2._M_allocated_capacity + 1);
        }
        if ((pxVar4->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) break;
      }
      std::
      pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
      ::
      pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&,_Style::Field_&,_true>
                (&local_b0,&local_d8,&local_160);
      std::
      _Hashtable<std::__cxx11::u16string,std::pair<std::__cxx11::u16string_const,Style::Field>,std::allocator<std::pair<std::__cxx11::u16string_const,Style::Field>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::u16string>,std::hash<std::__cxx11::u16string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::u16string_const,Style::Field>>(local_b8,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.second.pattern._M_dataplus._M_p != &local_b0.second.pattern.field_2) {
        operator_delete(local_b0.second.pattern._M_dataplus._M_p,
                        local_b0.second.pattern.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_b0.second.name._M_dataplus._M_p != &local_b0.second.name.field_2) {
        operator_delete(local_b0.second.name._M_dataplus._M_p,
                        local_b0.second.name.field_2._M_allocated_capacity * 2 + 2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_b0.first._M_dataplus._M_p != &local_b0.first.field_2) {
        operator_delete(local_b0.first._M_dataplus._M_p,
                        local_b0.first.field_2._M_allocated_capacity * 2 + 2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160.pattern._M_dataplus._M_p != &local_160.pattern.field_2) {
        operator_delete(local_160.pattern._M_dataplus._M_p,
                        CONCAT71(local_160.pattern.field_2._M_allocated_capacity._1_7_,
                                 local_160.pattern.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_160.name._M_dataplus._M_p != &local_160.name.field_2) {
        operator_delete(local_160.name._M_dataplus._M_p,
                        local_160.name.field_2._M_allocated_capacity * 2 + 2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity * 2 + 2);
      }
      if ((pxVar6->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
        __assert_fail("this->m_parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidxml-1.13/rapidxml.hpp"
                      ,0x3ee,
                      "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                     );
      }
      pxVar6 = pxVar6->m_next_sibling;
    } while (pxVar6 != (xml_node<char> *)0x0);
  }
  return;
}

Assistant:

void Style::parseFields (xml_node<> *def, unordered_map<u16string, Field> &fields) {
    for (xml_node<> *node = def->first_node(); node; node = node->next_sibling()) {
        EXPECT_NAME(node, "bcf:field");

        u16string name = utf.utf8to16(node->value());
        Field field { name };

        for (xml_attribute<> *attr = node->first_attribute(); attr; attr = attr->next_attribute()) {
            string attrName = attr->name();
            string attrVal = attr->value();

            if (attrName == "fieldtype") {
                if (attrVal == "field") {
                    field.type = Field::Type::Field;
                } else {
                    ASSERT(attrVal == "list");
                    field.type = Field::Type::List;
                }
            } else if (attrName == "datatype") {
                if (attrVal == "literal") {
                    field.dataType = Field::Data::Literal;
                } else if (attrVal == "name") {
                    field.dataType = Field::Data::Name;
                } else if (attrVal == "key") {
                    field.dataType = Field::Data::Key;
                } else if (attrVal == "entrykey") {
                    field.dataType = Field::Data::EntryKey;
                } else if (attrVal == "date") {
                    field.dataType = Field::Data::Date;
                } else if (attrVal == "verbatim") {
                    field.dataType = Field::Data::Verbatim;
                } else if (attrVal == "integer") {
                    field.dataType = Field::Data::Integer;
                } else if (attrVal == "range") {
                    field.dataType = Field::Data::Range;
                } else if (attrVal == "code") {
                    field.dataType = Field::Data::Code;
                } else if (attrVal == "uri") {
                    field.dataType = Field::Data::URI;
                } else if (attrVal == "datepart") {
                    field.dataType = Field::Data::Datepart;
                } else if (attrVal == "keyword") {
                    field.dataType = Field::Data::Keyword;
                } else if (attrVal == "option") {
                    field.dataType = Field::Data::Option;
                } else {
                    std::cerr << "Unhandled datatype " << attrVal << "\n";
                }
            } else if (attrName == "format") {
                if (attrVal == "xsv") {
                    field.format = Field::Format::XSV;
                } else {
                    std::cerr << "Unhandled format " << attrVal << "\n";
                    field.format = Field::Format::Other;
                }
            } else if (attrName == "nullok") {
                // NOTE: Technically the schema does not allow any other value besides "true",
                //  so the check is useless
                if (attrVal == "true") field.nullok = true;
            } else if (attrName == "skip_out") {
                if (attrVal == "true") field.skipout = true;
            } else if (attrName == "label") {
                if (attrVal == "true") field.label = true;
            }
        }

        fields.insert({ name, field });
    }
}